

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

Dar_Cut_t * Dar_ObjComputeCuts_rec(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Dar_Cut_t *pDVar2;
  
  while( true ) {
    if ((Dar_Cut_t *)(pObj->field_5).pData != (Dar_Cut_t *)0x0) {
      return (Dar_Cut_t *)(pObj->field_5).pData;
    }
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar1 != 4) break;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  if (uVar1 == 2) {
    pDVar2 = Dar_ObjPrepareCuts(p,pObj);
    return pDVar2;
  }
  Dar_ObjComputeCuts_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Dar_ObjComputeCuts_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  pDVar2 = Dar_ObjComputeCuts(p,pObj,0);
  return pDVar2;
}

Assistant:

Dar_Cut_t * Dar_ObjComputeCuts_rec( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Dar_ObjCuts(pObj) )
        return Dar_ObjCuts(pObj);
    if ( Aig_ObjIsCi(pObj) )
        return Dar_ObjPrepareCuts( p, pObj );
    if ( Aig_ObjIsBuf(pObj) )
        return Dar_ObjComputeCuts_rec( p, Aig_ObjFanin0(pObj) );
    Dar_ObjComputeCuts_rec( p, Aig_ObjFanin0(pObj) );
    Dar_ObjComputeCuts_rec( p, Aig_ObjFanin1(pObj) );
    return Dar_ObjComputeCuts( p, pObj, 0 );
}